

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void calculate_next_ppu_intr(Emulator *e)

{
  Emulator *e_local;
  
  if ((e->state).ppu.lcdc.display == FALSE) {
    (e->state).ppu.next_intr_ticks = 0xffffffffffffffff;
  }
  else {
    (e->state).ppu.next_intr_ticks = (e->state).ppu.sync_ticks + (ulong)(e->state).ppu.state_ticks;
  }
  calculate_next_intr(e);
  return;
}

Assistant:

static void calculate_next_ppu_intr(Emulator* e) {
  if (LCDC.display) {
    /* TODO: Looser bounds on sync points. This syncs at every state
     * transition, even though we often won't need to sync that often. */
    PPU.next_intr_ticks = PPU.sync_ticks + PPU.state_ticks;
  } else {
    PPU.next_intr_ticks = INVALID_TICKS;
  }
  calculate_next_intr(e);
}